

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int offset_compare(void *lhsv,void *rhsv)

{
  CMavail_period_ptr rhs;
  CMavail_period_ptr lhs;
  void *rhsv_local;
  void *lhsv_local;
  undefined4 local_4;
  
  if (*lhsv < *rhsv) {
    local_4 = -1;
  }
  else if (*rhsv < *lhsv) {
    local_4 = 1;
  }
  else {
    local_4 = (int)*(undefined8 *)((long)lhsv + 8) - (int)*(undefined8 *)((long)rhsv + 8);
  }
  return local_4;
}

Assistant:

static 
int offset_compare(const void* lhsv, const void* rhsv)
 {
     CMavail_period_ptr lhs = (CMavail_period_ptr) lhsv;
     CMavail_period_ptr rhs = (CMavail_period_ptr) rhsv;
     if (lhs->offset.tv_sec < rhs->offset.tv_sec)
	 return -1;
     if (lhs->offset.tv_sec > rhs->offset.tv_sec)
	 return 1;
     return lhs->offset.tv_usec - rhs->offset.tv_usec;
 }